

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

Regexp * re2::Regexp::ConcatOrAlternate
                   (RegexpOp op,Regexp **sub,int nsub,ParseFlags flags,bool can_factor)

{
  uint uVar1;
  Regexp **sub_00;
  Regexp *pRVar2;
  Regexp *pRVar3;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar4;
  ulong uVar5;
  uint16 uVar6;
  Regexp **sub_01;
  int i;
  ulong uVar7;
  int n;
  
  uVar6 = (uint16)flags;
  if (nsub == 0) {
    pRVar2 = (Regexp *)operator_new(0x28);
    if (op == kRegexpAlternate) {
      pRVar2->op_ = '\x01';
      pRVar2->simple_ = '\0';
      pRVar2->parse_flags_ = uVar6;
      pRVar2->ref_ = 1;
    }
    else {
      pRVar2->op_ = '\x02';
      pRVar2->simple_ = '\0';
      pRVar2->parse_flags_ = uVar6;
      pRVar2->ref_ = 1;
    }
    *(undefined8 *)((long)&pRVar2->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar2->field_7).field_3.cc_ + 6) = 0;
    *(undefined8 *)&pRVar2->nsub_ = 0;
    *(undefined8 *)((long)&pRVar2->field_5 + 6) = 0;
    *(undefined2 *)((long)&pRVar2->field_7 + 0xe) = 0;
    return pRVar2;
  }
  uVar7 = (ulong)(uint)nsub;
  if (nsub == 1) {
    return *sub;
  }
  if (can_factor && op == kRegexpAlternate) {
    uVar7 = 0xffffffffffffffff;
    if (-1 < nsub) {
      uVar7 = (long)nsub << 3;
    }
    sub_00 = (Regexp **)operator_new__(uVar7);
    memcpy(sub_00,sub,(long)nsub << 3);
    uVar1 = FactorAlternation(sub_00,nsub,flags);
    if (uVar1 == 1) {
      pRVar2 = *sub_00;
      goto LAB_0011a882;
    }
    uVar7 = (ulong)uVar1;
    sub = sub_00;
  }
  else {
    sub_00 = (Regexp **)0x0;
  }
  n = (int)uVar7;
  if (0xffff < n) {
    pRVar2 = (Regexp *)operator_new(0x28);
    pRVar2->op_ = (uint8)op;
    pRVar2->simple_ = '\0';
    pRVar2->parse_flags_ = uVar6;
    pRVar2->ref_ = 1;
    *(undefined8 *)&pRVar2->nsub_ = 0;
    *(undefined8 *)((long)&pRVar2->field_5 + 6) = 0;
    *(undefined8 *)((long)&pRVar2->down_ + 6) = 0;
    *(undefined8 *)((long)&(pRVar2->field_7).field_3.cc_ + 6) = 0;
    *(undefined2 *)((long)&pRVar2->field_7 + 0xe) = 0;
    uVar1 = (n + 0xfffeU) / 0xffff;
    AllocSub(pRVar2,uVar1);
    if (pRVar2->nsub_ < 2) {
      paVar4 = &pRVar2->field_5;
    }
    else {
      paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar2->field_5).submany_;
    }
    uVar1 = uVar1 - 1;
    uVar7 = 0;
    sub_01 = sub;
    do {
      pRVar3 = ConcatOrAlternate(op,sub_01,0xffff,flags,false);
      paVar4[uVar7].subone_ = pRVar3;
      uVar7 = uVar7 + 1;
      sub_01 = sub_01 + 0xffff;
    } while (uVar1 != uVar7);
    pRVar3 = ConcatOrAlternate(op,sub + uVar1 * 0xffff,n + uVar1 * -0xffff,flags,false);
    paVar4[uVar1].subone_ = pRVar3;
    if (sub_00 == (Regexp **)0x0) {
      return pRVar2;
    }
    operator_delete__(sub_00);
    return pRVar2;
  }
  pRVar2 = (Regexp *)operator_new(0x28);
  pRVar2->op_ = (uint8)op;
  pRVar2->simple_ = '\0';
  pRVar2->parse_flags_ = uVar6;
  pRVar2->ref_ = 1;
  *(undefined8 *)&pRVar2->nsub_ = 0;
  *(undefined8 *)((long)&pRVar2->field_5 + 6) = 0;
  *(undefined8 *)((long)&pRVar2->down_ + 6) = 0;
  *(undefined8 *)((long)&(pRVar2->field_7).field_3.cc_ + 6) = 0;
  *(undefined2 *)((long)&pRVar2->field_7 + 0xe) = 0;
  AllocSub(pRVar2,n);
  if (pRVar2->nsub_ < 2) {
    paVar4 = &pRVar2->field_5;
  }
  else {
    paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar2->field_5).submany_;
  }
  if (0 < n) {
    uVar5 = 0;
    do {
      paVar4[uVar5] = *(anon_union_8_2_3df47e5c_for_Regexp_7 *)(sub + uVar5);
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  if (sub_00 == (Regexp **)0x0) {
    return pRVar2;
  }
LAB_0011a882:
  operator_delete__(sub_00);
  return pRVar2;
}

Assistant:

Regexp* Regexp::ConcatOrAlternate(RegexpOp op, Regexp** sub, int nsub,
                                  ParseFlags flags, bool can_factor) {
  if (nsub == 1)
    return sub[0];

  if (nsub == 0) {
    if (op == kRegexpAlternate)
      return new Regexp(kRegexpNoMatch, flags);
    else
      return new Regexp(kRegexpEmptyMatch, flags);
  }

  Regexp** subcopy = NULL;
  if (op == kRegexpAlternate && can_factor) {
    // Going to edit sub; make a copy so we don't step on caller.
    subcopy = new Regexp*[nsub];
    memmove(subcopy, sub, nsub * sizeof sub[0]);
    sub = subcopy;
    nsub = FactorAlternation(sub, nsub, flags);
    if (nsub == 1) {
      Regexp* re = sub[0];
      delete[] subcopy;
      return re;
    }
  }

  if (nsub > kMaxNsub) {
    // Too many subexpressions to fit in a single Regexp.
    // Make a two-level tree.  Two levels gets us to 65535^2.
    int nbigsub = (nsub+kMaxNsub-1)/kMaxNsub;
    Regexp* re = new Regexp(op, flags);
    re->AllocSub(nbigsub);
    Regexp** subs = re->sub();
    for (int i = 0; i < nbigsub - 1; i++)
      subs[i] = ConcatOrAlternate(op, sub+i*kMaxNsub, kMaxNsub, flags, false);
    subs[nbigsub - 1] = ConcatOrAlternate(op, sub+(nbigsub-1)*kMaxNsub,
                                          nsub - (nbigsub-1)*kMaxNsub, flags,
                                          false);
    delete[] subcopy;
    return re;
  }

  Regexp* re = new Regexp(op, flags);
  re->AllocSub(nsub);
  Regexp** subs = re->sub();
  for (int i = 0; i < nsub; i++)
    subs[i] = sub[i];

  delete[] subcopy;
  return re;
}